

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

int xfer_download_gotpkt(fxp_xfer *xfer,sftp_packet *pktin)

{
  uint uVar1;
  undefined8 *puVar2;
  int iVar3;
  sftp_request *req;
  ulong uVar4;
  
  req = sftp_find_request(pktin);
  if (req == (sftp_request *)0x0) {
    return -0x80000000;
  }
  puVar2 = (undefined8 *)req->userdata;
  if (puVar2 == (undefined8 *)0x0) {
    fxp_error_message = "request ID is not part of the current download";
    fxp_errtype = -1;
    return -0x80000000;
  }
  iVar3 = fxp_read_recv(pktin,req,(char *)*puVar2,*(int *)(puVar2 + 1));
  *(int *)((long)puVar2 + 0xc) = iVar3;
  if ((iVar3 == 0) || (iVar3 < 0 && fxp_errtype == 1)) {
    xfer->eof = true;
    *(undefined8 *)((long)puVar2 + 0xc) = 0xffffffff00000000;
  }
  else if (iVar3 < 0) {
    xfer->err = true;
    *(undefined4 *)(puVar2 + 2) = 0xffffffff;
    return -1;
  }
  *(undefined4 *)(puVar2 + 2) = 1;
  uVar1 = *(uint *)((long)puVar2 + 0xc);
  if ((0 < (int)uVar1) && (xfer->furthestdata < (ulong)puVar2[3])) {
    xfer->furthestdata = puVar2[3];
  }
  if ((int)uVar1 < *(int *)(puVar2 + 1)) {
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    if (uVar4 + puVar2[3] < xfer->filesize) {
      xfer->filesize = uVar4 + puVar2[3];
    }
  }
  if (xfer->filesize < xfer->furthestdata) {
    fxp_error_message = "received a short buffer from FXP_READ, but not at EOF";
    fxp_errtype = -1;
    xfer->err = true;
    return -1;
  }
  return 1;
}

Assistant:

int xfer_download_gotpkt(struct fxp_xfer *xfer, struct sftp_packet *pktin)
{
    struct sftp_request *rreq;
    struct req *rr;

    rreq = sftp_find_request(pktin);
    if (!rreq)
        return INT_MIN;            /* this packet doesn't even make sense */
    rr = (struct req *)fxp_get_userdata(rreq);
    if (!rr) {
        fxp_internal_error("request ID is not part of the current download");
        return INT_MIN;                /* this packet isn't ours */
    }
    rr->retlen = fxp_read_recv(pktin, rreq, rr->buffer, rr->len);
#ifdef DEBUG_DOWNLOAD
    printf("read request %p has returned [%d]\n", rr, rr->retlen);
#endif

    if ((rr->retlen < 0 && fxp_error_type()==SSH_FX_EOF) || rr->retlen == 0) {
        xfer->eof = true;
        rr->retlen = 0;
        rr->complete = -1;
#ifdef DEBUG_DOWNLOAD
        printf("setting eof\n");
#endif
    } else if (rr->retlen < 0) {
        /* some error other than EOF; signal it back to caller */
        xfer_set_error(xfer);
        rr->complete = -1;
        return -1;
    }

    rr->complete = 1;

    /*
     * Special case: if we have received fewer bytes than we
     * actually read, we should do something. For the moment I'll
     * just throw an ersatz FXP error to signal this; the SFTP
     * draft I've got says that it can't happen except on special
     * files, in which case seeking probably has very little
     * meaning and so queueing an additional read request to fill
     * up the gap sounds like the wrong answer. I'm not sure what I
     * should be doing here - if it _was_ a special file, I suspect
     * I simply shouldn't have been queueing multiple requests in
     * the first place...
     */
    if (rr->retlen > 0 && xfer->furthestdata < rr->offset) {
        xfer->furthestdata = rr->offset;
#ifdef DEBUG_DOWNLOAD
        printf("setting furthestdata = %"PRIu64"\n", xfer->furthestdata);
#endif
    }

    if (rr->retlen < rr->len) {
        uint64_t filesize = rr->offset + (rr->retlen < 0 ? 0 : rr->retlen);
#ifdef DEBUG_DOWNLOAD
        printf("short block! trying filesize = %"PRIu64"\n", filesize);
#endif
        if (xfer->filesize > filesize) {
            xfer->filesize = filesize;
#ifdef DEBUG_DOWNLOAD
            printf("actually changing filesize\n");
#endif
        }
    }

    if (xfer->furthestdata > xfer->filesize) {
        fxp_error_message = "received a short buffer from FXP_READ, but not"
            " at EOF";
        fxp_errtype = -1;
        xfer_set_error(xfer);
        return -1;
    }

    return 1;
}